

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iso_writer.cpp
# Opt level: O3

void __thiscall
FileEntryInfo::FileEntryInfo
          (FileEntryInfo *this,IsoWriter *owner,FileEntryInfo *parent,uint8_t objectId,
          FileTypes fileType)

{
  uint8_t *puVar1;
  
  (this->m_files).super__Vector_base<FileEntryInfo_*,_std::allocator<FileEntryInfo_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_files).super__Vector_base<FileEntryInfo_*,_std::allocator<FileEntryInfo_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_subDirs).super__Vector_base<FileEntryInfo_*,_std::allocator<FileEntryInfo_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_files).super__Vector_base<FileEntryInfo_*,_std::allocator<FileEntryInfo_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_subDirs).super__Vector_base<FileEntryInfo_*,_std::allocator<FileEntryInfo_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_subDirs).super__Vector_base<FileEntryInfo_*,_std::allocator<FileEntryInfo_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->m_owner = owner;
  this->m_parent = parent;
  puVar1 = (uint8_t *)0x0;
  this->m_sectorNum = 0;
  this->m_sectorsUsed = 0;
  this->m_objectId = objectId;
  (this->m_name)._M_dataplus._M_p = (pointer)&(this->m_name).field_2;
  (this->m_name)._M_string_length = 0;
  (this->m_name).field_2._M_local_buf[0] = '\0';
  this->m_fileType = fileType;
  this->m_sectorBufferSize = 0;
  this->m_subMode = false;
  (this->m_extents).super__Vector_base<Extent,_std::allocator<Extent>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_extents).super__Vector_base<Extent,_std::allocator<Extent>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_extents).super__Vector_base<Extent,_std::allocator<Extent>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_fileSize = 0;
  if ((fileType == RealtimeFile) || (fileType == File)) {
    puVar1 = (uint8_t *)operator_new__(0x800);
  }
  this->m_sectorBuffer = puVar1;
  return;
}

Assistant:

FileEntryInfo::FileEntryInfo(IsoWriter *owner, FileEntryInfo *parent, const uint8_t objectId, const FileTypes fileType)
    : m_owner(owner),
      m_parent(parent),
      m_sectorNum(0),
      m_sectorsUsed(0),
      m_objectId(objectId),
      m_fileType(fileType),
      m_fileSize(0),
      m_sectorBufferSize(0),
      m_subMode(false)
{
    if (isFile())
        m_sectorBuffer = new uint8_t[SECTOR_SIZE];
    else
        m_sectorBuffer = nullptr;
}